

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF16.cpp
# Opt level: O2

void leopard::ff16::FWHT(ffe_t *data,uint m,uint m_truncated)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  ushort *puVar16;
  
  uVar6 = 4;
  uVar4 = 1;
  while (uVar5 = uVar6, uVar5 < 0x10001) {
    uVar11 = (ulong)uVar4;
    for (iVar12 = 0; iVar12 < (int)m; iVar12 = iVar12 + uVar5) {
      lVar8 = (long)iVar12;
      puVar16 = data + lVar8;
      for (; lVar8 < (int)(uVar4 + iVar12); lVar8 = lVar8 + 1) {
        uVar3 = *(ushort *)((long)puVar16 + (ulong)(uVar4 * 2));
        uVar9 = (uint)uVar3 + (uint)*puVar16;
        uVar6 = (uint)*puVar16 - (uint)uVar3;
        uVar7 = (uint)puVar16[uVar11 * 3] + (uint)puVar16[uVar11 * 2];
        uVar10 = (uint)puVar16[uVar11 * 2] - (uint)puVar16[uVar11 * 3];
        uVar14 = (uVar9 >> 0x10) + uVar9 & 0xffff;
        uVar9 = (uVar6 >> 0x10) + uVar6 & 0xffff;
        uVar7 = (uVar7 >> 0x10) + uVar7 & 0xffff;
        uVar6 = (uVar10 >> 0x10) + uVar10 & 0xffff;
        iVar1 = uVar7 + uVar14;
        iVar15 = uVar14 - uVar7;
        iVar2 = uVar6 + uVar9;
        iVar13 = uVar9 - uVar6;
        *puVar16 = (short)((uint)iVar1 >> 0x10) + (short)iVar1;
        *(short *)((long)puVar16 + (ulong)(uVar4 * 2)) = (short)((uint)iVar2 >> 0x10) + (short)iVar2
        ;
        puVar16[uVar11 * 2] = (short)((uint)iVar15 >> 0x10) + (short)iVar15;
        puVar16[uVar11 * 3] = (short)((uint)iVar13 >> 0x10) + (short)iVar13;
        puVar16 = puVar16 + 1;
      }
    }
    uVar4 = uVar5;
    uVar6 = uVar5 * 4;
  }
  return;
}

Assistant:

static void FWHT(ffe_t* data, const unsigned m, const unsigned m_truncated)
{
    // Decimation in time: Unroll 2 layers at a time
    unsigned dist = 1, dist4 = 4;
    for (; dist4 <= m; dist = dist4, dist4 <<= 2)
    {
        // For each set of dist*4 elements:
#pragma omp parallel for
        for (int r = 0; r < (int)m_truncated; r += dist4)
        {
            // For each set of dist elements:
            const int i_end = r + dist;
            for (int i = r; i < i_end; ++i)
                FWHT_4(data + i, dist);
        }
    }

    // If there is one layer left:
    if (dist < m)
#pragma omp parallel for
        for (int i = 0; i < (int)dist; ++i)
            FWHT_2(data[i], data[i + dist]);
}